

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_buffer_pool.cpp
# Opt level: O0

int __thiscall
libtorrent::disk_buffer_pool::allocate_iovec
          (disk_buffer_pool *this,span<libtorrent::span<char>_> iov)

{
  char *pcVar1;
  char *buf;
  span<char> j;
  span<char> *__end3;
  span<char> *__begin3;
  span<libtorrent::span<char>_> *__range3;
  span<char> local_68;
  span<char> *local_58;
  span<char> *i;
  span<char> *__end1;
  span<char> *__begin1;
  span<libtorrent::span<char>_> *__range1;
  unique_lock<std::mutex> l;
  disk_buffer_pool *this_local;
  span<libtorrent::span<char>_> iov_local;
  
  iov_local.m_ptr = (span<char> *)iov.m_len;
  this_local = (disk_buffer_pool *)iov.m_ptr;
  l._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&__range1,&this->m_pool_mutex);
  __begin1 = (span<char> *)&this_local;
  __end1 = span<libtorrent::span<char>_>::begin((span<libtorrent::span<char>_> *)__begin1);
  i = span<libtorrent::span<char>_>::end((span<libtorrent::span<char>_> *)__begin1);
  for (; __end1 != i; __end1 = __end1 + 1) {
    local_58 = __end1;
    pcVar1 = allocate_buffer_impl(this,(unique_lock<std::mutex> *)&__range1,"pending read");
    span<char>::span(&local_68,pcVar1,0x4000);
    local_58->m_ptr = local_68.m_ptr;
    local_58->m_len = local_68.m_len;
    pcVar1 = span<char>::data(local_58);
    if (pcVar1 == (char *)0x0) {
      __end3 = span<libtorrent::span<char>_>::begin((span<libtorrent::span<char>_> *)&this_local);
      j.m_len = (difference_type)
                span<libtorrent::span<char>_>::end((span<libtorrent::span<char>_> *)&this_local);
      goto LAB_0062e597;
    }
  }
  iov_local.m_len._4_4_ = 0;
LAB_0062e677:
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&__range1);
  return iov_local.m_len._4_4_;
LAB_0062e597:
  if (__end3 == (span<char> *)j.m_len) goto LAB_0062e640;
  span<char>::span<libtorrent::span<char>,char,void>((span<char> *)&buf,__end3);
  pcVar1 = span<char>::data((span<char> *)&buf);
  if (pcVar1 == (char *)0x0) goto LAB_0062e640;
  pcVar1 = span<char>::data((span<char> *)&buf);
  remove_buffer_in_use(this,pcVar1);
  free_buffer_impl(this,pcVar1,(unique_lock<std::mutex> *)&__range1);
  __end3 = __end3 + 1;
  goto LAB_0062e597;
LAB_0062e640:
  iov_local.m_len._4_4_ = -1;
  goto LAB_0062e677;
}

Assistant:

int disk_buffer_pool::allocate_iovec(span<iovec_t> iov)
	{
		std::unique_lock<std::mutex> l(m_pool_mutex);
		for (auto& i : iov)
		{
			i = { allocate_buffer_impl(l, "pending read"), std::size_t(default_block_size)};
			if (i.data() == nullptr)
			{
				// uh oh. We failed to allocate the buffer!
				// we need to roll back and free all the buffers
				// we've already allocated
				for (auto j : iov)
				{
					if (j.data() == nullptr) break;
					char* buf = j.data();
					TORRENT_ASSERT(is_disk_buffer(buf, l));
					remove_buffer_in_use(buf);
					free_buffer_impl(buf, l);
				}
				return -1;
			}
		}
		return 0;
	}